

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O2

void __thiscall
icu_63::UVector::insertElementAt(UVector *this,int32_t elem,int32_t index,UErrorCode *status)

{
  UElement *pUVar1;
  UBool UVar2;
  ulong uVar3;
  long lVar4;
  
  if (((-1 < index) && (index <= this->count)) &&
     (UVar2 = ensureCapacity(this,this->count + 1,status), UVar2 != '\0')) {
    uVar3 = (ulong)(uint)index;
    for (lVar4 = (long)this->count; pUVar1 = this->elements, (long)uVar3 < lVar4; lVar4 = lVar4 + -1
        ) {
      pUVar1[lVar4] = pUVar1[lVar4 + -1];
    }
    pUVar1[uVar3].pointer = (void *)0x0;
    this->elements[uVar3].integer = elem;
    this->count = this->count + 1;
  }
  return;
}

Assistant:

void UVector::insertElementAt(int32_t elem, int32_t index, UErrorCode &status) {
    // must have 0 <= index <= count
    if (0 <= index && index <= count && ensureCapacity(count + 1, status)) {
        for (int32_t i=count; i>index; --i) {
            elements[i] = elements[i-1];
        }
        elements[index].pointer = NULL;
        elements[index].integer = elem;
        ++count;
    }
    /* else index out of range */
}